

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

value_type __thiscall
jsoncons::jsonpath::detail::
min_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(min_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar7;
  size_t sVar8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar9;
  error_code *in_RCX;
  ulong uVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar11;
  ulong i;
  size_t i_00;
  value_type vVar12;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_40;
  
  pcVar1 = *(char **)ec;
  if (((long)ec->_M_cat - (long)pcVar1 >> 3) * -0x5555555555555555 -
      (long)(args->
            super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != 0) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar7);
    uVar11 = extraout_RDX;
    goto LAB_0042b664;
  }
  if (*pcVar1 == '\0') {
    pbVar7 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              (pcVar1 + 8);
  }
  else {
    pbVar7 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             (pcVar1 + 8);
  }
  pbVar9 = &local_40;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            (pbVar9,pbVar7);
  while (uVar5 = (byte)(pbVar9->field_0).json_ref_ & 0xf, uVar5 - 8 < 2) {
    pbVar9 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              ((long)&pbVar9->field_0 + 8);
  }
  if (uVar5 == 0xe) {
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::empty
                      (&local_40);
    if (bVar2) goto LAB_0042b64a;
    pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                       (&local_40,0);
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_number
                      (pbVar7);
    pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                       (&local_40,0);
    bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_string
                      (pbVar7);
    if (bVar2 || bVar3) {
      i = 1;
      i_00 = 0;
      while( true ) {
        sVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (&local_40);
        if (sVar8 <= i) break;
        pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (&local_40,i);
        bVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                is_number(pbVar7);
        if (bVar2 != bVar4) {
LAB_0042b695:
          std::error_code::operator=(in_RCX,invalid_type);
          pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null
                             ();
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
          uninitialized_copy((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)this,pbVar7);
          goto LAB_0042b65a;
        }
        pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (&local_40,i);
        bVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                is_string(pbVar7);
        if (bVar3 != bVar4) goto LAB_0042b695;
        pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (&local_40,i);
        pbVar9 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (&local_40,i_00);
        iVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::compare
                          (pbVar7,pbVar9);
        uVar10 = i;
        if (-1 < iVar6) {
          uVar10 = i_00;
        }
        i = i + 1;
        i_00 = uVar10;
      }
      pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                         (&local_40,i_00);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
                 pbVar7);
    }
    else {
      std::error_code::operator=(in_RCX,invalid_type);
      pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
                 pbVar7);
    }
  }
  else {
    std::error_code::operator=(in_RCX,invalid_type);
LAB_0042b64a:
    pbVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar7);
  }
LAB_0042b65a:
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy(&local_40);
  uVar11 = extraout_RDX_00;
LAB_0042b664:
  vVar12.field_0.int64_.val_ = uVar11;
  vVar12.field_0._0_8_ = this;
  return (value_type)vVar12.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_array())
            {
                //std::cout << "arg: " << arg0 << "\n";
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            if (arg0.empty())
            {
                return value_type::null();
            }
            bool is_number = arg0.at(0).is_number();
            bool is_string = arg0.at(0).is_string();
            if (!is_number && !is_string)
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            std::size_t index = 0;
            for (std::size_t i = 1; i < arg0.size(); ++i)
            {
                if (!(arg0.at(i).is_number() == is_number && arg0.at(i).is_string() == is_string))
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
                if (arg0.at(i) < arg0.at(index))
                {
                    index = i;
                }
            }

            return arg0.at(index);
        }